

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

void Js::JavascriptOperators::OP_LoadUndefinedToElementDynamic
               (Var instance,PropertyId propertyId,ScriptContext *scriptContext)

{
  bool bVar1;
  ThreadContext *pTVar2;
  BOOL BVar3;
  RecyclableObject *pRVar4;
  
  pTVar2 = scriptContext->threadContext;
  bVar1 = pTVar2->noJsReentrancy;
  pTVar2->noJsReentrancy = true;
  BVar3 = HasOwnPropertyNoHostObject(instance,propertyId);
  if (BVar3 == 0) {
    pRVar4 = VarTo<Js::RecyclableObject>(instance);
    (*(pRVar4->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
      [0x1f])(pRVar4,propertyId,
              (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
              super_JavascriptLibraryBase).undefinedValue.ptr);
  }
  pTVar2->noJsReentrancy = bVar1;
  return;
}

Assistant:

void JavascriptOperators::OP_LoadUndefinedToElementDynamic(Var instance, PropertyId propertyId, ScriptContext *scriptContext)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(Op_LdElemUndefDynamic, reentrancylock, scriptContext->GetThreadContext());
        if (!JavascriptOperators::HasOwnPropertyNoHostObject(instance, propertyId))
        {
            VarTo<RecyclableObject>(instance)->InitPropertyScoped(propertyId, scriptContext->GetLibrary()->GetUndefined());
        }
        JIT_HELPER_END(Op_LdElemUndefDynamic);
    }